

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpCodeUtilAsmJs.cpp
# Opt level: O2

OpLayoutTypeAsmJs Js::OpCodeUtilAsmJs::GetOpCodeLayout(OpCodeAsmJs op)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint32 *puVar4;
  
  if (op < InvalidOpCode) {
    if (Simd128_LdSlot_I16 < op) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtilAsmJs.cpp"
                                  ,0x42,"(op < (sizeof(*__countof_helper(OpCodeAsmJsLayouts)) + 0))"
                                  ,"op < _countof(OpCodeAsmJsLayouts)");
      if (!bVar2) {
LAB_007dbff4:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    puVar4 = (uint32 *)(OpCodeAsmJsLayouts + (ulong)op * 4);
  }
  else {
    if (0x171 < op - 0x100) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtilAsmJs.cpp"
                                  ,0x48,
                                  "(opIndex < (sizeof(*__countof_helper(ExtendedOpCodeAsmJsLayouts)) + 0))"
                                  ,"opIndex < _countof(ExtendedOpCodeAsmJsLayouts)");
      if (!bVar2) goto LAB_007dbff4;
      *puVar3 = 0;
    }
    puVar4 = (uint32 *)(ExtendedOpCodeAsmJsLayouts + (ulong)(op - 0x100) * 4);
  }
  return (OpLayoutTypeAsmJs)*puVar4;
}

Assistant:

OpLayoutTypeAsmJs OpCodeUtilAsmJs::GetOpCodeLayout(OpCodeAsmJs op)
    {
        if ((uint)op <= (uint)Js::OpCodeAsmJs::MaxByteSizedOpcodes)
        {
            Assert(op < _countof(OpCodeAsmJsLayouts));
            __analysis_assume(op < _countof(OpCodeAsmJsLayouts));
            return OpCodeAsmJsLayouts[(uint)op];
        }

        uint opIndex = op - (Js::OpCodeAsmJs::MaxByteSizedOpcodes + 1);
        Assert(opIndex < _countof(ExtendedOpCodeAsmJsLayouts));
        __analysis_assume(opIndex < _countof(ExtendedOpCodeAsmJsLayouts));
        return ExtendedOpCodeAsmJsLayouts[opIndex];
    }